

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O0

bool __thiscall
QPlainTextEditSearchWidget::doSearch
          (QPlainTextEditSearchWidget *this,bool searchDown,bool allowRestartAtTop,bool updateUI)

{
  QRegularExpression *pQVar1;
  QString *pQVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  QMargins *pQVar9;
  MoveMode MVar10;
  undefined1 auVar11 [16];
  int local_428;
  undefined4 local_3f0;
  byte local_3ea;
  int local_3d8;
  byte local_3d2;
  QArrayDataPointer<char16_t> local_3a0;
  QString local_388;
  QArrayDataPointer<char16_t> local_370;
  QString local_358;
  QArrayDataPointer<char16_t> local_340;
  QString local_328;
  QString local_310;
  QString local_2f8;
  QString local_2e0;
  QString local_2c8;
  byte local_2a9;
  QArrayDataPointer<char16_t> local_2a8;
  byte local_289;
  QArrayDataPointer<char16_t> local_288;
  undefined1 local_270 [8];
  QString fgColorCode;
  QArrayDataPointer<char16_t> local_250;
  byte local_231;
  QArrayDataPointer<char16_t> local_230;
  byte local_211;
  QArrayDataPointer<char16_t> local_210;
  byte local_1f1;
  QArrayDataPointer<char16_t> local_1f0;
  undefined1 local_1d8 [8];
  QString bgColorCode;
  int marginBottom;
  int searchWidgetHotArea;
  QMargins margins;
  QRect rect;
  bool local_18d;
  QFlags<QRegularExpression::PatternOption> local_18c;
  QRegularExpression local_188;
  int local_17c;
  Int local_178;
  int result;
  byte local_16d;
  QFlags<QRegularExpression::PatternOption> local_16c;
  QRegularExpression local_168;
  byte local_159;
  QFlags<QTextDocument::FindFlag> local_158;
  bool found;
  QFlags<QTextDocument::FindFlag> options;
  bool caseSensitive;
  int searchMode;
  QString local_138;
  undefined1 local_110 [8];
  QString text;
  bool updateUI_local;
  bool allowRestartAtTop_local;
  bool searchDown_local;
  QPlainTextEditSearchWidget *this_local;
  char16_t *str_5;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str;
  char16_t *str_6;
  char16_t *str_7;
  char16_t *str_8;
  
  text.d.size._5_1_ = updateUI;
  text.d.size._6_1_ = allowRestartAtTop;
  text.d.size._7_1_ = searchDown;
  uVar7 = QTimer::isActive();
  if ((uVar7 & 1) != 0) {
    stopDebounce(this);
  }
  QLineEdit::text();
  bVar3 = QString::isEmpty((QString *)local_110);
  if (bVar3) {
    if ((text.d.size._5_1_ & 1) != 0) {
      pQVar2 = *(QString **)(*(long *)(this + 0x28) + 8);
      QLatin1String::QLatin1String((QLatin1String *)&searchMode,"");
      QString::QString(&local_138,_searchMode);
      QWidget::setStyleSheet(pQVar2);
      QString::~QString(&local_138);
    }
    this_local._7_1_ = false;
  }
  else {
    options.i = QComboBox::currentIndex();
    bVar4 = QAbstractButton::isChecked();
    found = (bool)(bVar4 & 1);
    QFlags<QTextDocument::FindFlag>::QFlags(&local_158,(uint)((text.d.size._7_1_ & 1) == 0));
    if (options.i == 1) {
      QFlags<QTextDocument::FindFlag>::operator|=(&local_158,FindWholeWords);
    }
    if ((found & 1U) != 0) {
      QFlags<QTextDocument::FindFlag>::operator|=(&local_158,FindCaseSensitively);
    }
    QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x88),0));
    local_16d = 0;
    if (options.i == 2) {
      pQVar1 = *(QRegularExpression **)(this + 0x88);
      QFlags<QRegularExpression::PatternOption>::QFlags
                (&local_16c,(byte)~found & CaseInsensitiveOption);
      QRegularExpression::QRegularExpression
                (&local_168,(QString *)local_110,(QFlags_conflict1 *)(ulong)local_16c.i);
      local_16d = 1;
      result = local_158.i;
      local_3d2 = QPlainTextEdit::find(pQVar1,(QFlags_conflict1 *)&local_168);
    }
    else {
      local_178 = local_158.i;
      local_3d2 = QPlainTextEdit::find(*(QString **)(this + 0x88),(QFlags_conflict1 *)local_110);
    }
    if ((local_16d & 1) != 0) {
      QRegularExpression::~QRegularExpression(&local_168);
    }
    local_159 = local_3d2 & 1;
    QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x88),0));
    if ((local_159 & 1) != 0) {
      if ((text.d.size._7_1_ & 1) == 0) {
        local_3d8 = *(int *)(this + 0x34) + -1;
        *(int *)(this + 0x34) = local_3d8;
      }
      else {
        local_3d8 = *(int *)(this + 0x34) + 1;
        *(int *)(this + 0x34) = local_3d8;
      }
      local_17c = local_3d8;
      piVar8 = std::min<int>(&local_17c,(int *)(this + 0x30));
      *(int *)(this + 0x34) = *piVar8;
      updateSearchCountLabelText(this);
    }
    if (((local_159 & 1) == 0) && ((text.d.size._6_1_ & 1) != 0)) {
      MVar10 = 0xb;
      if ((text.d.size._7_1_ & 1) != 0) {
        MVar10 = KeepAnchor;
      }
      QPlainTextEdit::moveCursor((MoveOperation)*(undefined8 *)(this + 0x88),MVar10);
      local_18d = options.i != 2;
      if (local_18d) {
        local_3ea = QPlainTextEdit::find(*(QString **)(this + 0x88),(QFlags_conflict1 *)local_110);
      }
      else {
        pQVar1 = *(QRegularExpression **)(this + 0x88);
        QFlags<QRegularExpression::PatternOption>::QFlags
                  (&local_18c,(byte)~found & CaseInsensitiveOption);
        QRegularExpression::QRegularExpression
                  (&local_188,(QString *)local_110,(QFlags_conflict1 *)(ulong)local_18c.i);
        local_3ea = QPlainTextEdit::find(pQVar1,(QFlags_conflict1 *)&local_188);
      }
      local_18d = !local_18d;
      local_159 = local_3ea & 1;
      if (local_18d) {
        QRegularExpression::~QRegularExpression(&local_188);
      }
      if (((local_159 & 1) != 0) && ((text.d.size._5_1_ & 1) != 0)) {
        if ((text.d.size._7_1_ & 1) == 0) {
          local_3f0 = *(undefined4 *)(this + 0x30);
        }
        else {
          local_3f0 = 1;
        }
        *(undefined4 *)(this + 0x34) = local_3f0;
        updateSearchCountLabelText(this);
      }
    }
    if ((text.d.size._5_1_ & 1) != 0) {
      margins._8_8_ = QPlainTextEdit::cursorRect();
      QWidget::layout();
      auVar11 = QLayout::contentsMargins();
      margins._0_8_ = auVar11._8_8_;
      _marginBottom = auVar11._0_8_;
      iVar5 = QWidget::height(*(QWidget **)(this + 0x88));
      iVar6 = QWidget::height((QWidget *)this);
      bgColorCode.d.size._4_4_ = iVar5 - iVar6;
      iVar5 = QRect::y((QRect *)&margins.m_right);
      if (bgColorCode.d.size._4_4_ < iVar5) {
        local_428 = QWidget::height((QWidget *)this);
        local_428 = local_428 + 10;
      }
      else {
        local_428 = 0;
      }
      bgColorCode.d.size._0_4_ = local_428;
      iVar5 = QMargins::bottom((QMargins *)&marginBottom);
      if (iVar5 != (int)bgColorCode.d.size) {
        QMargins::setBottom((QMargins *)&marginBottom,(int)bgColorCode.d.size);
        pQVar9 = (QMargins *)QWidget::layout();
        QLayout::setContentsMargins(pQVar9);
      }
      local_1f1 = 0;
      local_211 = 0;
      local_231 = 0;
      fgColorCode.d.size._7_1_ = 0;
      if (((byte)this[0x90] & 1) == 0) {
        if ((local_159 & 1) == 0) {
          QArrayDataPointer<char16_t>::QArrayDataPointer(&local_250,(Data *)0x0,L"#FAE9EB",7);
          fgColorCode.d.size._7_1_ = 1;
          QString::QString((QString *)local_1d8,&local_250);
        }
        else {
          QArrayDataPointer<char16_t>::QArrayDataPointer(&local_230,(Data *)0x0,L"#D5FAE2",7);
          local_231 = 1;
          QString::QString((QString *)local_1d8,&local_230);
        }
      }
      else if ((local_159 & 1) == 0) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_210,(Data *)0x0,L"#8d2b36",7);
        local_211 = 1;
        QString::QString((QString *)local_1d8,&local_210);
      }
      else {
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1f0,(Data *)0x0,L"#135a13",7);
        local_1f1 = 1;
        QString::QString((QString *)local_1d8,&local_1f0);
      }
      if ((fgColorCode.d.size._7_1_ & 1) != 0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_250);
      }
      if ((local_231 & 1) != 0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_230);
      }
      if ((local_211 & 1) != 0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_210);
      }
      if ((local_1f1 & 1) != 0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1f0);
      }
      local_289 = 0;
      local_2a9 = 0;
      if (((byte)this[0x90] & 1) == 0) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_2a8,(Data *)0x0,L"#404040",7);
        local_2a9 = 1;
        QString::QString((QString *)local_270,&local_2a8);
      }
      else {
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_288,(Data *)0x0,L"#cccccc",7);
        local_289 = 1;
        QString::QString((QString *)local_270,&local_288);
      }
      if ((local_2a9 & 1) != 0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a8);
      }
      if ((local_289 & 1) != 0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
      }
      pQVar2 = *(QString **)(*(long *)(this + 0x28) + 8);
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&local_340,(Data *)0x0,L"* { background: ",0x10);
      QString::QString(&local_328,&local_340);
      operator+(&local_310,&local_328,(QString *)local_1d8);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_370,(Data *)0x0,L"; color: ",9);
      QString::QString(&local_358,&local_370);
      operator+(&local_2f8,&local_310,&local_358);
      operator+(&local_2e0,&local_2f8,(QString *)local_270);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3a0,(Data *)0x0,L"; }",3);
      QString::QString(&local_388,&local_3a0);
      operator+(&local_2c8,&local_2e0,&local_388);
      QWidget::setStyleSheet(pQVar2);
      QString::~QString(&local_2c8);
      QString::~QString(&local_388);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a0);
      QString::~QString(&local_2e0);
      QString::~QString(&local_2f8);
      QString::~QString(&local_358);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_370);
      QString::~QString(&local_310);
      QString::~QString(&local_328);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_340);
      setSearchExtraSelections(this);
      QString::~QString((QString *)local_270);
      QString::~QString((QString *)local_1d8);
    }
    this_local._7_1_ = (bool)(local_159 & 1);
  }
  QString::~QString((QString *)local_110);
  return this_local._7_1_;
}

Assistant:

bool QPlainTextEditSearchWidget::doSearch(bool searchDown,
                                          bool allowRestartAtTop,
                                          bool updateUI) {
    if (_debounceTimer.isActive()) {
        stopDebounce();
    }

    const QString text = ui->searchLineEdit->text();

    if (text.isEmpty()) {
        if (updateUI) {
            ui->searchLineEdit->setStyleSheet(QLatin1String(""));
        }

        return false;
    }

    const int searchMode = ui->modeComboBox->currentIndex();
    const bool caseSensitive = ui->matchCaseSensitiveButton->isChecked();

    QFlags<QTextDocument::FindFlag> options =
        searchDown ? QTextDocument::FindFlag(0) : QTextDocument::FindBackward;
    if (searchMode == WholeWordsMode) {
        options |= QTextDocument::FindWholeWords;
    }

    if (caseSensitive) {
        options |= QTextDocument::FindCaseSensitively;
    }

    // block signal to reduce too many signals being fired and too many updates
    _textEdit->blockSignals(true);

    bool found =
        searchMode == RegularExpressionMode
            ?
#if (QT_VERSION >= QT_VERSION_CHECK(5, 13, 0))
            _textEdit->find(
                QRegularExpression(
                    text, caseSensitive
                              ? QRegularExpression::NoPatternOption
                              : QRegularExpression::CaseInsensitiveOption),
                options)
            :
#else
            _textEdit->find(QRegExp(text, caseSensitive ? Qt::CaseSensitive
                                                        : Qt::CaseInsensitive),
                            options)
            :
#endif
            _textEdit->find(text, options);

    _textEdit->blockSignals(false);

    if (found) {
        const int result =
            searchDown ? ++_currentSearchResult : --_currentSearchResult;
        _currentSearchResult = std::min(result, _searchResultCount);

        updateSearchCountLabelText();
    }

    // start at the top (or bottom) if not found
    if (!found && allowRestartAtTop) {
        _textEdit->moveCursor(searchDown ? QTextCursor::Start
                                         : QTextCursor::End);
        found =
            searchMode == RegularExpressionMode
                ?
#if (QT_VERSION >= QT_VERSION_CHECK(5, 13, 0))
                _textEdit->find(
                    QRegularExpression(
                        text, caseSensitive
                                  ? QRegularExpression::NoPatternOption
                                  : QRegularExpression::CaseInsensitiveOption),
                    options)
                :
#else
                _textEdit->find(
                    QRegExp(text, caseSensitive ? Qt::CaseSensitive
                                                : Qt::CaseInsensitive),
                    options)
                :
#endif
                _textEdit->find(text, options);

        if (found && updateUI) {
            _currentSearchResult = searchDown ? 1 : _searchResultCount;
            updateSearchCountLabelText();
        }
    }

    if (updateUI) {
        const QRect rect = _textEdit->cursorRect();
        QMargins margins = _textEdit->layout()->contentsMargins();
        const int searchWidgetHotArea = _textEdit->height() - this->height();
        const int marginBottom =
            (rect.y() > searchWidgetHotArea) ? (this->height() + 10) : 0;

        // move the search box a bit up if we would block the search result
        if (margins.bottom() != marginBottom) {
            margins.setBottom(marginBottom);
            _textEdit->layout()->setContentsMargins(margins);
        }

        // add a background color according if we found the text or not
        const QString bgColorCode =
            _darkMode
                ? (found ? QStringLiteral("#135a13")
                         : QStringLiteral("#8d2b36"))
                : found ? QStringLiteral("#D5FAE2") : QStringLiteral("#FAE9EB");
        const QString fgColorCode =
            _darkMode ? QStringLiteral("#cccccc") : QStringLiteral("#404040");

        ui->searchLineEdit->setStyleSheet(
            QStringLiteral("* { background: ") + bgColorCode +
            QStringLiteral("; color: ") + fgColorCode + QStringLiteral("; }"));

        // restore the search extra selections after the find command
        this->setSearchExtraSelections();
    }

    return found;
}